

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O3

void __thiscall
libsbox::Stream::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stream *this,Value *value)

{
  ushort uVar1;
  char *pcVar2;
  ContextManager *pCVar3;
  Ch *__s;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = (value->data_).f.flags;
  if (uVar1 != 0) {
    if ((uVar1 >> 10 & 1) == 0) {
      pCVar3 = ContextManager::get();
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"JSON is incorrect","");
      (**pCVar3->_vptr_ContextManager)(pCVar3);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      uVar1 = (value->data_).f.flags;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pCVar3 = ContextManager::get();
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"JSON is incorrect","");
      (**pCVar3->_vptr_ContextManager)(pCVar3);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    __s = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(value);
    pcVar2 = (char *)(this->filename_)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)__s);
    return;
  }
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->filename_)._M_string_length,0x136bb1);
  return;
}

Assistant:

void Stream::deserialize_request(const rapidjson::Value &value) {
    if (value.IsNull()) {
        filename_ = "";
    } else {
        CHECK_TYPE(value, String);
        GET(filename_, value, String);
    }
}